

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_>::SetUp
          (NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  data_type_t_conflict *pdVar1;
  double *pdVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  char *in_R9;
  aom_noise_model_params_t params;
  AssertHelper local_50;
  Message local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  params.bit_depth = 8;
  params.use_highbd = 1;
  params.shape = '\x01';
  params._1_3_ = 0;
  params.lag = 3;
  iVar5 = aom_noise_model_init(&this->model_,params);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar5 != 0;
  if (iVar5 == 0) {
    testing::Message::Message(&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"aom_noise_model_init(&model_, params)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x228,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    (this->random_).random_.state_ = 0x1874b;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->data_,0xc000);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->denoised_,0xc000);
    std::vector<double,_std::allocator<double>_>::resize(&this->noise_,0xc000);
    std::vector<double,_std::allocator<double>_>::resize(&this->renoise_,0x4000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->flat_blocks_,0x40);
    puVar3 = (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->denoised_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->noise_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = -3;
    for (lVar8 = 0; lVar8 != 0x18000; lVar8 = lVar8 + 0x8000) {
      pdVar1 = (data_type_t_conflict *)((long)puVar3 + lVar8);
      this->denoised_ptr_[lVar7] = pdVar1;
      *(pointer *)(this->strides_ + lVar7 * 2) = pdVar6;
      pdVar2 = (double *)((long)puVar4 + lVar8);
      this->noise_ptr_[lVar7] = pdVar2;
      this->chroma_sub_[lVar7] = 0x80;
      this->denoised_ptr_raw_[lVar7] = (uint8_t *)pdVar1;
      *(double **)((long)this[1].model_.combined_state + lVar7 * 8 + -0x20) = pdVar2;
      pdVar6 = pdVar6 + 0x4000;
      lVar7 = lVar7 + 1;
    }
    this->chroma_sub_[0] = 0;
    this->chroma_sub_[1] = 0;
  }
  return;
}

Assistant:

void SetUp() override {
    const aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3,
                                              T::kBitDepth, T::kUseHighBD };
    ASSERT_TRUE(aom_noise_model_init(&model_, params));

    random_.Reset(100171);

    data_.resize(kWidth * kHeight * 3);
    denoised_.resize(kWidth * kHeight * 3);
    noise_.resize(kWidth * kHeight * 3);
    renoise_.resize(kWidth * kHeight);
    flat_blocks_.resize(kNumBlocksX * kNumBlocksY);

    for (int c = 0, offset = 0; c < 3; ++c, offset += kWidth * kHeight) {
      data_ptr_[c] = &data_[offset];
      noise_ptr_[c] = &noise_[offset];
      denoised_ptr_[c] = &denoised_[offset];
      strides_[c] = kWidth;

      data_ptr_raw_[c] = (uint8_t *)&data_[offset];
      denoised_ptr_raw_[c] = (uint8_t *)&denoised_[offset];
    }
    chroma_sub_[0] = 0;
    chroma_sub_[1] = 0;
  }